

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O1

void fast_gmm_free(fast_gmm_t *fg)

{
  int32 *piVar1;
  
  if (fg != (fast_gmm_t *)0x0) {
    piVar1 = fg->gmms->ci_occu;
    if (piVar1 != (int32 *)0x0) {
      ckd_free(piVar1);
    }
    piVar1 = fg->gmms->idx;
    if (piVar1 != (int32 *)0x0) {
      ckd_free(piVar1);
    }
    if (fg->gmms != (gmm_select_t *)0x0) {
      ckd_free(fg->gmms);
    }
    if (fg->gaus != (gau_select_t *)0x0) {
      ckd_free(fg->gaus);
    }
    if (fg->downs != (downsampling_t *)0x0) {
      ckd_free(fg->downs);
    }
    ckd_free(fg);
    return;
  }
  return;
}

Assistant:

void
fast_gmm_free(fast_gmm_t * fg)
{
    if (fg) {
        if (fg->gmms->ci_occu)
            ckd_free(fg->gmms->ci_occu);
        if (fg->gmms->idx)
            ckd_free(fg->gmms->idx);

        if (fg->gmms)
            ckd_free(fg->gmms);

        if (fg->gaus)
            ckd_free(fg->gaus);

        if (fg->downs)
            ckd_free(fg->downs);

        ckd_free(fg);
    }
}